

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disass.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  ushort uVar3;
  int __fd;
  int iVar4;
  ulong uVar5;
  void *__buf;
  ssize_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uStack_b0;
  void *local_a8;
  uint local_a0;
  uint local_9c;
  ulong local_98;
  uint local_8c;
  ulong local_88;
  void *local_80;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  ushort local_72;
  byte local_6f;
  uint8_t y;
  uint8_t x;
  uint8_t kk;
  uint8_t n;
  uint16_t nnn_1;
  char local_68;
  uint8_t opcode_1;
  uint16_t inst_1;
  int pc_1;
  char disass [32];
  int iStack_3c;
  uint16_t nnn;
  uint8_t opcode;
  uint16_t inst;
  int pc;
  unsigned_long __vla_expr0;
  uint8_t *memory;
  int size;
  int fd;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    uStack_b0 = 0x10126e;
    printf("Loading %s\n");
    uStack_b0 = 0x10127f;
    __fd = open(argv[1],0);
    if (__fd == -1) {
      uStack_b0 = 0x101294;
      error("open");
    }
    uStack_b0 = 0x1012a5;
    uVar5 = lseek(__fd,0,2);
    iVar4 = (int)uVar5;
    uStack_b0 = 0x1012b6;
    lseek(__fd,0,0);
    if (iVar4 == -1) {
      uStack_b0 = 0x1012c8;
      error("lseek getting file size");
    }
    uStack_b0 = 0x1012d9;
    printf("File size %d\n",uVar5 & 0xffffffff);
    uStack_b0 = 0x1012e2;
    __buf = operator_new__((long)iVar4);
    uStack_b0 = 0x1012f6;
    sVar6 = read(__fd,__buf,(long)iVar4);
    if (sVar6 != iVar4) {
      uStack_b0 = 0x10130b;
      error("read");
    }
    uStack_b0 = 0x101313;
    close(__fd);
    lVar2 = -((ulong)(uint)(iVar4 / 2) + 0xf & 0xfffffffffffffff0);
    local_80 = (void *)((long)&local_a8 + lVar2);
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10134b;
    memset((void *)((long)&local_a8 + lVar2),0,(ulong)(uint)(iVar4 / 2));
    for (iStack_3c = 0; iStack_3c < iVar4 + -1; iStack_3c = iStack_3c + 2) {
      uVar3 = CONCAT11(*(undefined1 *)((long)__buf + (long)iStack_3c),
                       *(undefined1 *)((long)__buf + (long)(iStack_3c + 1)));
      disass._30_2_ = uVar3 & 0xfff;
      if ((char)((int)(uVar3 & 0xf000) >> 0xc) == '\x02') {
        if ((int)((ushort)disass._30_2_ - 0x200) < iVar4) {
          *(undefined1 *)((long)local_80 + (long)((int)((ushort)disass._30_2_ - 0x200) / 2)) = 1;
        }
        else {
          uVar5 = (ulong)(ushort)disass._30_2_;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1013ec;
          fprintf(_stderr,"ERROR Call out of bounds: Calling %p at %p, max addr is %p\n",uVar5,
                  (ulong)(iStack_3c + 0x200),(ulong)(iVar4 + 0x200));
        }
      }
    }
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10142c;
    printf("\nSTART:\n");
    for (_kk = 0; _kk < iVar4 + -1; _kk = _kk + 2) {
      local_75 = *(byte *)((long)__buf + (long)_kk);
      local_74 = *(byte *)((long)__buf + (long)_kk + 1);
      _y = CONCAT11(local_75,local_74);
      local_6f = local_75 >> 4;
      local_72 = _y & 0xfff;
      local_73 = local_74 & 0xf;
      local_75 = local_75 & 0xf;
      local_76 = local_74 >> 4;
      local_88 = (ulong)local_6f;
      switch(local_88) {
      case 0:
        local_8c = (uint)local_74;
        if (local_8c == 0xe0) {
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1014f6;
          snprintf(&local_68,0x20,"cls");
        }
        else if (local_8c == 0xee) {
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10150f;
          snprintf(&local_68,0x20,"ret");
        }
        else {
          uVar5 = (ulong)_y;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10152c;
          snprintf(&local_68,0x20,"Unknown inst 0: 0x%X",uVar5);
        }
        break;
      case 1:
        uVar5 = (ulong)local_72;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10154c;
        snprintf(&local_68,0x20,"jp    0x%X",uVar5);
        break;
      case 2:
        uVar5 = (ulong)local_72;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10156c;
        snprintf(&local_68,0x20,"call  0x%X",uVar5);
        break;
      case 3:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_74;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101591;
        snprintf(&local_68,0x20,"se    V%d, 0x%X",uVar5,uVar8);
        break;
      case 4:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_74;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1015b6;
        snprintf(&local_68,0x20,"sne   V%d, 0x%X",uVar5,uVar8);
        break;
      case 5:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_76;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1015db;
        snprintf(&local_68,0x20,"se    V%d, V%d",uVar5,uVar8);
        break;
      case 6:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_74;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101600;
        snprintf(&local_68,0x20,"ld    V%d, 0x%X",uVar5,uVar8);
        break;
      case 7:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_74;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101625;
        snprintf(&local_68,0x20,"add   V%d, 0x%X",uVar5,uVar8);
        break;
      case 8:
        local_98 = (ulong)local_73;
        switch(local_98) {
        case 0:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101676;
          snprintf(&local_68,0x20,"ld    V%d, V%d",uVar5,uVar8);
          break;
        case 1:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10169b;
          snprintf(&local_68,0x20,"or    V%d, V%d",uVar5,uVar8);
          break;
        case 2:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1016c0;
          snprintf(&local_68,0x20,"and   V%d, V%d",uVar5,uVar8);
          break;
        case 3:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1016e5;
          snprintf(&local_68,0x20,"xor   V%d, V%d",uVar5,uVar8);
          break;
        case 4:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10170a;
          snprintf(&local_68,0x20,"add   V%d, V%d",uVar5,uVar8);
          break;
        case 5:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10172f;
          snprintf(&local_68,0x20,"sub   V%d, V%d",uVar5,uVar8);
          break;
        case 6:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101754;
          snprintf(&local_68,0x20,"shr   V%d {, V%d}",uVar5,uVar8);
          break;
        case 7:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101776;
          snprintf(&local_68,0x20,"subn  V%d, V%d",uVar5,uVar8);
          break;
        default:
          uVar5 = (ulong)_y;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1017b5;
          snprintf(&local_68,0x20,"Unknown inst 8: 0x%X",uVar5);
          break;
        case 0xe:
          uVar5 = (ulong)local_75;
          uVar8 = (ulong)local_76;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101798;
          snprintf(&local_68,0x20,"shl   V%d {, V%d}",uVar5,uVar8);
        }
        break;
      case 9:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_76;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1017da;
        snprintf(&local_68,0x20,"sne   V%d, V%d",uVar5,uVar8);
        break;
      case 10:
        uVar5 = (ulong)local_72;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1017fa;
        snprintf(&local_68,0x20,"ld    I, 0x%X",uVar5);
        break;
      case 0xb:
        uVar5 = (ulong)local_72;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10181a;
        snprintf(&local_68,0x20,"jp    V0, 0x%X",uVar5);
        break;
      case 0xc:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_74;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x10183f;
        snprintf(&local_68,0x20,"rnd   V%d, 0x%X",uVar5,uVar8);
        break;
      case 0xd:
        uVar5 = (ulong)local_75;
        uVar8 = (ulong)local_76;
        uVar9 = (ulong)local_73;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101869;
        snprintf(&local_68,0x20,"drw   V%d, V%d, 0x%X",uVar5,uVar8,uVar9);
        break;
      case 0xe:
        local_9c = (uint)local_74;
        if (local_9c == 0x9e) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1018ab;
          snprintf(&local_68,0x20,"skp   V%d",uVar5);
        }
        else if (local_9c == 0xa1) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1018c8;
          snprintf(&local_68,0x20,"sknp  V%d",uVar5);
        }
        else {
          uVar5 = (ulong)_y;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1018e5;
          snprintf(&local_68,0x20,"Unknown inst E: 0x%X",uVar5);
        }
        break;
      case 0xf:
        local_a0 = (uint)local_74;
        if (local_a0 == 7) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1019a5;
          snprintf(&local_68,0x20,"ld    V%d, DT",uVar5);
        }
        else if (local_a0 == 10) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1019c5;
          snprintf(&local_68,0x20,"ld    V%d, K",uVar5);
        }
        else if (local_a0 == 0x15) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1019e5;
          snprintf(&local_68,0x20,"ld    DT, V%d",uVar5);
        }
        else if (local_a0 == 0x18) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101a05;
          snprintf(&local_68,0x20,"ld    ST, V%d",uVar5);
        }
        else if (local_a0 == 0x1e) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101a25;
          snprintf(&local_68,0x20,"add   I, V%d",uVar5);
        }
        else if (local_a0 == 0x29) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101a45;
          snprintf(&local_68,0x20,"ld    F, V%d",uVar5);
        }
        else if (local_a0 == 0x33) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101a62;
          snprintf(&local_68,0x20,"ld    B, V%d",uVar5);
        }
        else if (local_a0 == 0x55) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101a7f;
          snprintf(&local_68,0x20,"ld    [I], V%d",uVar5);
        }
        else if (local_a0 == 0x65) {
          uVar5 = (ulong)local_75;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101a9c;
          snprintf(&local_68,0x20,"ld    V%d, [I]",uVar5);
        }
        else {
          uVar5 = (ulong)_y;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101ab9;
          snprintf(&local_68,0x20,"Unknown inst F: 0x%X",uVar5);
        }
        break;
      default:
        uVar5 = (ulong)local_6f;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101ad6;
        snprintf(&local_68,0x20,"Unknown opcode: 0x%X",uVar5);
      }
      lVar1 = (long)_kk;
      if ((*(byte *)((long)local_80 + (long)(_kk / 2)) & 1) != 0) {
        uVar7 = _kk + 0x200;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101b07;
        printf("\nFUNCTION 0x%X:\n",(ulong)uVar7,lVar1 % 2 & 0xffffffff);
      }
      uVar7 = _kk + 0x200;
      uVar5 = (ulong)_y;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101b26;
      printf("    %04X:     %04X       %s\n",(ulong)uVar7,uVar5,&local_68);
    }
    if (__buf != (void *)0x0) {
      local_a8 = __buf;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x101b51;
      operator_delete__(__buf);
    }
    return 0;
  }
  uStack_b0 = 0x10124e;
  fprintf(_stderr,"Usage: %s romfile\n",*argv);
  uStack_b0 = 0x101258;
  exit(1);
}

Assistant:

int main(int argc, char** argv){
	if (argc != 2){
		fprintf(stderr, "Usage: %s romfile\n", argv[0]);
		exit(EXIT_FAILURE);
	}
	
	printf("Loading %s\n", argv[1]);

	// Open file
	int fd = open(argv[1], O_RDONLY);
	if (fd == -1)
		error("open");

	// Get file size
	int size = lseek(fd, 0, SEEK_END);
	lseek(fd, 0, SEEK_SET);
	if (size == -1)
		error("lseek getting file size");
	printf("File size %d\n", size);

	// Load file content
	uint8_t* memory = new uint8_t[size];
	if (read(fd, memory, size) != size)
		error("read");
	close(fd);
	
	// For each call, record the called address
	bool calls[size/2];
	memset(calls, 0, sizeof(calls));
	for (int pc = 0; pc < size-1; pc += 2){
		uint16_t inst   = (memory[pc] << 8) | (memory[pc+1]);
		uint8_t  opcode = (inst & 0xF000) >> 12;
		uint16_t nnn    = inst & 0x0FFF;
		if (opcode == 0x2)
			if (nnn - 0x200 >= size)
				fprintf(stderr, "ERROR Call out of bounds: Calling %p at %p, max addr is %p\n", nnn, pc+0x200, size+0x200);
			else
				calls[(nnn-0x200)/2] = true;
	}

	// Disassemble
	printf("\nSTART:\n");
	char disass[32];
	for (int pc = 0; pc < size-1; pc += 2){
		// Fetch instruction and get opcode
		uint16_t inst   = (memory[pc] << 8) | (memory[pc+1]);
		uint8_t  opcode = (inst & 0xF000) >> 12;

		// Auxiliary values
		uint16_t nnn = inst & 0x0FFF;
		uint8_t  n   = inst & 0x000F;
		uint8_t  kk  = inst & 0x00FF;
		uint8_t  x   = (inst & 0x0F00) >> 8; 
		uint8_t  y   = (inst & 0x00F0) >> 4;

		switch (opcode){
			case 0x0:
				switch (kk){
					case 0xE0:
						// 00E0 - CLS
						// Clear the display.
						snprintf(disass, sizeof(disass), "cls");
						break;

					case 0xEE:
						// 00EE - RET
						// Return from a subroutine.
						snprintf(disass, sizeof(disass), "ret");
						break;

					default:
						snprintf(disass, sizeof(disass), "Unknown inst 0: 0x%X", inst);
						break;
				}
				break;

			case 0x1:
				// 1nnn - JP   addr
				// Jump to location nnn.
				snprintf(disass, sizeof(disass), "jp    0x%X", nnn);
				break;

			case 0x2:
				// 2nnn - CALL addr
				// Call subroutine at nnn.
				snprintf(disass, sizeof(disass), "call  0x%X", nnn);
				break;

			case 0x3:
				// 3xkk - SE Vx, byte
				// Skip next instruction if Vx = kk.
				snprintf(disass, sizeof(disass), "se    V%d, 0x%X", x, kk);
				break;

			case 0x4:
				// 4xkk - SNE Vx, byte
				// Skip next instruction if Vx != kk.
				snprintf(disass, sizeof(disass), "sne   V%d, 0x%X", x, kk);
				break;
				
			case 0x5:
				// 5xy0 - SE Vx, Vy
				// Skip next instruction if Vx = Vy.
				snprintf(disass, sizeof(disass), "se    V%d, V%d", x, y);
				break;

			case 0x6: 
				// 6xkk - ld    Vx, byte
				// Set Vx = kk.
				snprintf(disass, sizeof(disass), "ld    V%d, 0x%X", x, kk);
				break;

			case 0x7:
				// 7xkk - ADD Vx, byte
				// Set Vx = Vx + kk.
				snprintf(disass, sizeof(disass), "add   V%d, 0x%X", x, kk);
				break;

			case 0x8:
				switch (n){
					case 0x0:
						// 8xy0 - ld    Vx, Vy
						// Set Vx = Vy.
						snprintf(disass, sizeof(disass), "ld    V%d, V%d", x, y);
						break;
					
					case 0x1:
						// 8xy1 - OR Vx, Vy
						// Set Vx = Vx OR Vy.
						snprintf(disass, sizeof(disass), "or    V%d, V%d", x, y);
						break;

					case 0x2:
						// 8xy2 - AND Vx, Vy
						// Set Vx = Vx AND Vy.
						snprintf(disass, sizeof(disass), "and   V%d, V%d", x, y);
						break;

					case 0x3:
						// 8xy3 - XOR Vx, Vy
						// Set Vx = Vx XOR Vy.
						snprintf(disass, sizeof(disass), "xor   V%d, V%d", x, y);
						break;

					case 0x4:
						// 8xy4 - ADD Vx, Vy
						// Set Vx = Vx ADD Vy.
						snprintf(disass, sizeof(disass), "add   V%d, V%d", x, y);
						break;

					case 0x5:
						// 8xy5 - SUB Vx, Vy
						// Set Vx = Vx - Vy, set VF = NOT borrow.
						snprintf(disass, sizeof(disass), "sub   V%d, V%d", x, y);
						break;

					case 0x6:
						// 8xy6 - SHR Vx {, Vy}
						// Set Vx = Vx SHR 1.
						snprintf(disass, sizeof(disass), "shr   V%d {, V%d}", x, y);
						break;

					case 0x7:
						// 8xy7 - SUBN Vx, Vy
						// Set Vx = Vy - Vx, set VF = NOT borrow.
						snprintf(disass, sizeof(disass), "subn  V%d, V%d", x, y);
						break;

					case 0xE:
						// 8xyE - SHL Vx {, Vy}
						// Set Vx = Vx SHL 1.
						snprintf(disass, sizeof(disass), "shl   V%d {, V%d}", x, y);
						break;

					default:
						snprintf(disass, sizeof(disass), "Unknown inst 8: 0x%X", inst);
						break;
				}
				break;

			case 0x9:
				// 9xy0 - SNE Vx, Vy
				// Skip next instruction if Vx != Vy.
				snprintf(disass, sizeof(disass), "sne   V%d, V%d", x, y);
				break;

			case 0xA:
				// Annn - ld    I, addr
				// Set I = nnn.
				snprintf(disass, sizeof(disass), "ld    I, 0x%X", nnn);
				break;

			case 0xB:
				// Bnnn - JP   V0, addr
				// Jump to location nnn + V0.
				snprintf(disass, sizeof(disass), "jp    V0, 0x%X", nnn);
				break;

			case 0xC:
				// Cxkk - RND Vx, byte
				// Set Vx = random byte AND kk.
				snprintf(disass, sizeof(disass), "rnd   V%d, 0x%X", x, kk);
				break;

			case 0xD:
				// Dxyn - DRW Vx, Vy, nibble
				// Display n-byte sprite starting at memory location I at (Vx, Vy),
				// set VF = collision.
				snprintf(disass, sizeof(disass), "drw   V%d, V%d, 0x%X", x, y, n);
				break;

			case 0xE:
				switch (kk){
					case 0x9E:
						// Ex9E - SKP Vx
						// Skip next instruction if key with the value of Vx is
						// pressed.
						snprintf(disass, sizeof(disass), "skp   V%d", x);
						break;

					case 0xA1:
						// ExA1 - SKNP Vx
						// Skip next instruction if key with the value of Vx is not
						// pressed.
						snprintf(disass, sizeof(disass), "sknp  V%d", x);
						break;

					default:
						snprintf(disass, sizeof(disass), "Unknown inst E: 0x%X", inst);
						break;
				}
				break;

			case 0xF:
				switch (kk){
					case 0x07:
						// Fx07 - ld    Vx, DT
						// Set Vx = delay timer value.
						snprintf(disass, sizeof(disass), "ld    V%d, DT", x);
						break;
					
					case 0x0A:
						// Fx0A - ld    Vx, K
						// Wait for a key press, store the value of the key in Vx.
						snprintf(disass, sizeof(disass), "ld    V%d, K", x);
						break;

					case 0x15:
						// Fx15 - ld    DT, Vx
						// Set delay timer = Vx.
						snprintf(disass, sizeof(disass), "ld    DT, V%d", x);
						break;

					case 0x18:
						// Fx18 - ld    ST, Vx
						// Set sound timer = Vx.
						snprintf(disass, sizeof(disass), "ld    ST, V%d", x);
						break;

					case 0x1E:
						// Fx1E - ADD I, Vx
						// Set I = I + Vx. 
						snprintf(disass, sizeof(disass), "add   I, V%d", x);
						break;

					case 0x29:
						// Fx29 - ld    F, Vx
						// Set I = location of sprite for digit Vx.
						snprintf(disass, sizeof(disass), "ld    F, V%d", x);
						break;

					case 0x33:
						// Fx33 - ld    B, Vx
						// Store BCD representation of Vx in memory locations 
						// I, I+1, and I+2.
						snprintf(disass, sizeof(disass), "ld    B, V%d", x);
						break;

					case 0x55:
						// Fx55 - ld    [I], Vx
						// Store registers V0 through Vx in memory starting at
						// location I.
						snprintf(disass, sizeof(disass), "ld    [I], V%d", x);
						break;

					case 0x65:
						// Fx65 - ld    Vx, [I]
						// Read registers V0 through Vx from memory starting at
						// location I.
						snprintf(disass, sizeof(disass), "ld    V%d, [I]", x);
						break;

					default:
						snprintf(disass, sizeof(disass), "Unknown inst F: 0x%X", inst);
						break;
				}
				break;

			default:
				snprintf(disass, sizeof(disass), "Unknown opcode: 0x%X", opcode);
				break;
		}

		if (calls[pc/2])
			printf("\nFUNCTION 0x%X:\n", pc+0x200);
		printf("    %04X:     %04X       %s\n", pc+0x200, inst, disass);
	}

	delete[] memory;
}